

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int automataTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *__filename;
  FILE *__stream_00;
  char *pcVar5;
  size_t sVar6;
  xmlAutomataStatePtr pxVar7;
  bool bVar8;
  int max;
  int min;
  int to_2;
  int from_2;
  char *ptr_3;
  char *pcStack_3370;
  int state;
  char *ptr_2;
  int to_1;
  int from_1;
  char *ptr_1;
  int to;
  int from;
  char *ptr;
  xmlRegExecCtxtPtr exec;
  xmlRegexpPtr regexp;
  xmlAutomataStatePtr states [1000];
  long local_13f0;
  xmlAutomataPtr am;
  int res;
  int i;
  int ret;
  int len;
  char expr [5000];
  char *temp;
  FILE *output;
  FILE *input;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  exec = (xmlRegExecCtxtPtr)0x0;
  ptr = (char *)0x0;
  nb_tests = nb_tests + 1;
  for (am._4_4_ = 0; am._4_4_ < 1000; am._4_4_ = am._4_4_ + 1) {
    states[(long)am._4_4_ + -1] = (xmlAutomataStatePtr)0x0;
  }
  __stream = fopen64(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
    filename_local._4_4_ = 0xffffffff;
  }
  else {
    __filename = resultFilename(filename,"",".res");
    if (__filename == (char *)0x0) {
      fprintf(_stderr,"Out of memory\n");
      fatalError();
    }
    __stream_00 = fopen64(__filename,"wb");
    if (__stream_00 == (FILE *)0x0) {
      fprintf(_stderr,"failed to open output file %s\n",__filename);
      free(__filename);
      filename_local._4_4_ = 0xffffffff;
    }
    else {
      local_13f0 = xmlNewAutomata();
      if (local_13f0 == 0) {
        fprintf(_stderr,"Cannot create automata\n");
        fclose(__stream);
        filename_local._4_4_ = 0xffffffff;
      }
      else {
        regexp = (xmlRegexpPtr)xmlAutomataGetInitState(local_13f0);
        if (regexp == (xmlRegexpPtr)0x0) {
          fprintf(_stderr,"Cannot get start state\n");
          xmlFreeAutomata(local_13f0);
          fclose(__stream);
          filename_local._4_4_ = 0xffffffff;
        }
        else {
          res = 0;
          do {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      do {
                        do {
                          pcVar5 = fgets((char *)&ret,0x1194,__stream);
                          if (pcVar5 == (char *)0x0) goto LAB_0010cada;
                        } while ((char)ret == '#');
                        sVar6 = strlen((char *)&ret);
                        i = (int)sVar6;
                        do {
                          iVar4 = i;
                          i = iVar4 + -1;
                          bVar8 = false;
                          if ((((-1 < i) && (bVar8 = true, *(char *)((long)&ret + (long)i) != '\n'))
                              && (bVar8 = true, *(char *)((long)&ret + (long)i) != '\t')) &&
                             (bVar8 = true, *(char *)((long)&ret + (long)i) != '\r')) {
                            bVar8 = *(char *)((long)&ret + (long)i) == ' ';
                          }
                        } while (bVar8);
                        *(undefined1 *)((long)&ret + (long)iVar4) = 0;
                      } while (i < 0);
                      if (((local_13f0 == 0) || ((char)ret != 't')) || (ret._1_1_ != ' ')) break;
                      _to = (char *)((long)&ret + 2);
                      ptr_1._4_4_ = scanNumber((char **)&to);
                      if (*_to != ' ') {
                        fprintf(_stderr,"Bad line %s\n",&ret);
                        goto LAB_0010cada;
                      }
                      if (states[(long)ptr_1._4_4_ + -1] == (xmlAutomataStatePtr)0x0) {
                        pxVar7 = (xmlAutomataStatePtr)xmlAutomataNewState(local_13f0);
                        states[(long)ptr_1._4_4_ + -1] = pxVar7;
                      }
                      _to = _to + 1;
                      ptr_1._0_4_ = scanNumber((char **)&to);
                      if (*_to != ' ') {
                        fprintf(_stderr,"Bad line %s\n",&ret);
                        goto LAB_0010cada;
                      }
                      if (states[(long)(int)ptr_1 + -1] == (xmlAutomataStatePtr)0x0) {
                        pxVar7 = (xmlAutomataStatePtr)xmlAutomataNewState(local_13f0);
                        states[(long)(int)ptr_1 + -1] = pxVar7;
                      }
                      _to = _to + 1;
                      xmlAutomataNewTransition
                                (local_13f0,states[(long)ptr_1._4_4_ + -1],
                                 states[(long)(int)ptr_1 + -1],_to,0);
                    }
                    if (((local_13f0 == 0) || ((char)ret != 'e')) || (ret._1_1_ != ' ')) break;
                    _to_1 = (char *)((long)&ret + 2);
                    ptr_2._4_4_ = scanNumber((char **)&to_1);
                    if (*_to_1 != ' ') {
                      fprintf(_stderr,"Bad line %s\n",&ret);
                      goto LAB_0010cada;
                    }
                    if (states[(long)ptr_2._4_4_ + -1] == (xmlAutomataStatePtr)0x0) {
                      pxVar7 = (xmlAutomataStatePtr)xmlAutomataNewState(local_13f0);
                      states[(long)ptr_2._4_4_ + -1] = pxVar7;
                    }
                    _to_1 = _to_1 + 1;
                    ptr_2._0_4_ = scanNumber((char **)&to_1);
                    if (states[(long)(int)ptr_2 + -1] == (xmlAutomataStatePtr)0x0) {
                      pxVar7 = (xmlAutomataStatePtr)xmlAutomataNewState(local_13f0);
                      states[(long)(int)ptr_2 + -1] = pxVar7;
                    }
                    xmlAutomataNewEpsilon
                              (local_13f0,states[(long)ptr_2._4_4_ + -1],
                               states[(long)(int)ptr_2 + -1]);
                  }
                  if (((local_13f0 == 0) || ((char)ret != 'f')) || (ret._1_1_ != ' ')) break;
                  pcStack_3370 = (char *)((long)&ret + 2);
                  ptr_3._4_4_ = scanNumber(&stack0xffffffffffffcc90);
                  if (states[(long)(int)ptr_3._4_4_ + -1] == (xmlAutomataStatePtr)0x0) {
                    fprintf(_stderr,"Bad state %d : %s\n",(ulong)ptr_3._4_4_,&ret);
                    goto LAB_0010cada;
                  }
                  xmlAutomataSetFinalState(local_13f0,states[(long)(int)ptr_3._4_4_ + -1]);
                }
                if (((local_13f0 == 0) || ((char)ret != 'c')) || (ret._1_1_ != ' ')) break;
                _to_2 = (char *)((long)&ret + 2);
                iVar4 = scanNumber((char **)&to_2);
                if (*_to_2 != ' ') {
                  fprintf(_stderr,"Bad line %s\n",&ret);
                  goto LAB_0010cada;
                }
                if (states[(long)iVar4 + -1] == (xmlAutomataStatePtr)0x0) {
                  pxVar7 = (xmlAutomataStatePtr)xmlAutomataNewState(local_13f0);
                  states[(long)iVar4 + -1] = pxVar7;
                }
                _to_2 = _to_2 + 1;
                iVar1 = scanNumber((char **)&to_2);
                if (*_to_2 != ' ') {
                  fprintf(_stderr,"Bad line %s\n",&ret);
                  goto LAB_0010cada;
                }
                if (states[(long)iVar1 + -1] == (xmlAutomataStatePtr)0x0) {
                  pxVar7 = (xmlAutomataStatePtr)xmlAutomataNewState(local_13f0);
                  states[(long)iVar1 + -1] = pxVar7;
                }
                _to_2 = _to_2 + 1;
                iVar2 = scanNumber((char **)&to_2);
                if (*_to_2 != ' ') {
                  fprintf(_stderr,"Bad line %s\n",&ret);
                  goto LAB_0010cada;
                }
                _to_2 = _to_2 + 1;
                iVar3 = scanNumber((char **)&to_2);
                if (*_to_2 != ' ') {
                  fprintf(_stderr,"Bad line %s\n",&ret);
                  goto LAB_0010cada;
                }
                _to_2 = _to_2 + 1;
                xmlAutomataNewCountTrans
                          (local_13f0,states[(long)iVar4 + -1],states[(long)iVar1 + -1],_to_2,iVar2,
                           iVar3,0);
              }
              if (((local_13f0 != 0) && ((char)ret == '-')) && (ret._1_1_ == '-')) break;
              if (((char)ret == '=') && (ret._1_1_ == '>')) {
                if (exec == (xmlRegExecCtxtPtr)0x0) {
                  fprintf(__stream_00,"=> failed not compiled\n");
                }
                else {
                  if (ptr == (char *)0x0) {
                    ptr = (char *)xmlRegNewExecCtxt(exec,0);
                  }
                  if (res == 0) {
                    res = xmlRegExecPushString(ptr,0);
                  }
                  if (res == 1) {
                    fprintf(__stream_00,"=> Passed\n");
                  }
                  else if ((res == 0) || (res == -1)) {
                    fprintf(__stream_00,"=> Failed\n");
                  }
                  else if (res < 0) {
                    fprintf(__stream_00,"=> Error\n");
                  }
                  xmlRegFreeExecCtxt(ptr);
                  ptr = (char *)0x0;
                }
                res = 0;
              }
              else if (exec == (xmlRegExecCtxtPtr)0x0) {
                fprintf(_stderr,"Unexpected line %s\n",&ret);
              }
              else {
                if (ptr == (char *)0x0) {
                  ptr = (char *)xmlRegNewExecCtxt(exec,0);
                }
                res = xmlRegExecPushString(ptr,&ret,0);
              }
            }
            exec = (xmlRegExecCtxtPtr)xmlAutomataCompile(local_13f0);
            xmlFreeAutomata(local_13f0);
            local_13f0 = 0;
          } while (exec != (xmlRegExecCtxtPtr)0x0);
          fprintf(_stderr,"Failed to compile the automata");
LAB_0010cada:
          fclose(__stream_00);
          fclose(__stream);
          if (exec != (xmlRegExecCtxtPtr)0x0) {
            xmlRegFreeRegexp(exec);
          }
          if (ptr != (char *)0x0) {
            xmlRegFreeExecCtxt(ptr);
          }
          if (local_13f0 != 0) {
            xmlFreeAutomata(local_13f0);
          }
          iVar4 = compareFiles(__filename,result);
          if (iVar4 != 0) {
            fprintf(_stderr,"Result for %s failed in %s\n",filename,result);
          }
          am._0_4_ = (uint)(iVar4 != 0);
          if (__filename != (char *)0x0) {
            unlink(__filename);
            free(__filename);
          }
          filename_local._4_4_ = (uint)am;
        }
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
automataTest(const char *filename, const char *result,
             const char *err ATTRIBUTE_UNUSED, int options ATTRIBUTE_UNUSED) {
    FILE *input, *output;
    char *temp;
    char expr[5000];
    int len;
    int ret;
    int i;
    int res = 0;
    xmlAutomataPtr am;
    xmlAutomataStatePtr states[1000];
    xmlRegexpPtr regexp = NULL;
    xmlRegExecCtxtPtr exec = NULL;

    nb_tests++;

    for (i = 0;i<1000;i++)
	states[i] = NULL;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	return(-1);
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    am = xmlNewAutomata();
    if (am == NULL) {
        fprintf(stderr,
		"Cannot create automata\n");
	fclose(input);
	return(-1);
    }
    states[0] = xmlAutomataGetInitState(am);
    if (states[0] == NULL) {
        fprintf(stderr,
		"Cannot get start state\n");
	xmlFreeAutomata(am);
	fclose(input);
	return(-1);
    }
    ret = 0;

    while (fgets(expr, 4500, input) != NULL) {
	if (expr[0] == '#')
	    continue;
	len = strlen(expr);
	len--;
	while ((len >= 0) &&
	       ((expr[len] == '\n') || (expr[len] == '\t') ||
		(expr[len] == '\r') || (expr[len] == ' '))) len--;
	expr[len + 1] = 0;
	if (len >= 0) {
	    if ((am != NULL) && (expr[0] == 't') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		xmlAutomataNewTransition(am, states[from], states[to],
			                 BAD_CAST ptr, NULL);
	    } else if ((am != NULL) && (expr[0] == 'e') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		xmlAutomataNewEpsilon(am, states[from], states[to]);
	    } else if ((am != NULL) && (expr[0] == 'f') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int state;

		state = scanNumber(&ptr);
		if (states[state] == NULL) {
		    fprintf(stderr,
			    "Bad state %d : %s\n", state, expr);
		    break;
		}
		xmlAutomataSetFinalState(am, states[state]);
	    } else if ((am != NULL) && (expr[0] == 'c') && (expr[1] == ' ')) {
		char *ptr = &expr[2];
		int from, to;
		int min, max;

		from = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[from] == NULL)
		    states[from] = xmlAutomataNewState(am);
		ptr++;
		to = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		if (states[to] == NULL)
		    states[to] = xmlAutomataNewState(am);
		ptr++;
		min = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		max = scanNumber(&ptr);
		if (*ptr != ' ') {
		    fprintf(stderr,
			    "Bad line %s\n", expr);
		    break;
		}
		ptr++;
		xmlAutomataNewCountTrans(am, states[from], states[to],
			                 BAD_CAST ptr, min, max, NULL);
	    } else if ((am != NULL) && (expr[0] == '-') && (expr[1] == '-')) {
		/* end of the automata */
		regexp = xmlAutomataCompile(am);
		xmlFreeAutomata(am);
		am = NULL;
		if (regexp == NULL) {
		    fprintf(stderr,
			    "Failed to compile the automata");
		    break;
		}
	    } else if ((expr[0] == '=') && (expr[1] == '>')) {
		if (regexp == NULL) {
		    fprintf(output, "=> failed not compiled\n");
		} else {
		    if (exec == NULL)
			exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		    if (ret == 0) {
			ret = xmlRegExecPushString(exec, NULL, NULL);
		    }
		    if (ret == 1)
			fprintf(output, "=> Passed\n");
		    else if ((ret == 0) || (ret == -1))
			fprintf(output, "=> Failed\n");
		    else if (ret < 0)
			fprintf(output, "=> Error\n");
		    xmlRegFreeExecCtxt(exec);
		    exec = NULL;
		}
		ret = 0;
	    } else if (regexp != NULL) {
		if (exec == NULL)
		    exec = xmlRegNewExecCtxt(regexp, NULL, NULL);
		ret = xmlRegExecPushString(exec, BAD_CAST expr, NULL);
	    } else {
		fprintf(stderr,
			"Unexpected line %s\n", expr);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (regexp != NULL)
	xmlRegFreeRegexp(regexp);
    if (exec != NULL)
	xmlRegFreeExecCtxt(exec);
    if (am != NULL)
	xmlFreeAutomata(am);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(res);
}